

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::Net::clear(Net *this)

{
  Layer *pLVar1;
  pointer pcVar2;
  layer_destroyer_func p_Var3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  ulong uVar7;
  NetPrivate *pNVar8;
  pointer ppLVar9;
  pointer ppLVar10;
  ulong uVar11;
  Option opt1;
  undefined4 local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::_M_erase_at_end
            (&this->d->blobs,
             (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
             super__Vector_impl_data._M_start);
  pNVar8 = this->d;
  ppLVar9 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar10 != ppLVar9) {
    uVar11 = 0;
    do {
      pLVar1 = ppLVar9[uVar11];
      local_78 = *(undefined4 *)&this->opt;
      iStack_74 = (this->opt).num_threads;
      uStack_70 = *(undefined4 *)&(this->opt).blob_allocator;
      uStack_6c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
      local_68 = *(undefined4 *)&(this->opt).workspace_allocator;
      uStack_64 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
      iStack_60 = (this->opt).openmp_blocktime;
      uStack_5c._0_1_ = (this->opt).use_winograd_convolution;
      uStack_5c._1_1_ = (this->opt).use_sgemm_convolution;
      uStack_5c._2_1_ = (this->opt).use_int8_inference;
      uStack_5c._3_1_ = (this->opt).use_vulkan_compute;
      local_58._0_1_ = (this->opt).use_bf16_storage;
      local_58._1_1_ = (this->opt).use_fp16_packed;
      local_58._2_1_ = (this->opt).use_fp16_storage;
      local_58._3_1_ = (this->opt).use_fp16_arithmetic;
      uStack_54._0_1_ = (this->opt).use_int8_packed;
      uStack_54._1_1_ = (this->opt).use_int8_storage;
      uStack_54._2_1_ = (this->opt).use_int8_arithmetic;
      uStack_54._3_1_ = (this->opt).use_packing_layout;
      uStack_50._0_1_ = (this->opt).use_shader_pack8;
      uStack_50._1_1_ = (this->opt).use_subgroup_basic;
      uStack_50._2_1_ = (this->opt).use_subgroup_vote;
      uStack_50._3_1_ = (this->opt).use_subgroup_ballot;
      uStack_4c._0_1_ = (this->opt).use_subgroup_shuffle;
      uStack_4c._1_1_ = (this->opt).use_image_storage;
      uVar4 = (this->opt).use_tensor_storage;
      uVar5 = (this->opt).use_weight_fp16_storage;
      uStack_4c._2_2_ = CONCAT11(uVar5,uVar4);
      local_48 = (this->opt).flush_denormals;
      uStack_44._0_1_ = (this->opt).use_local_pool_allocator;
      uStack_44._1_1_ = (this->opt).use_reserved_1;
      uStack_44._2_1_ = (this->opt).use_reserved_2;
      uStack_44._3_1_ = (this->opt).use_reserved_3;
      uStack_40._0_1_ = (this->opt).use_reserved_4;
      uStack_40._1_1_ = (this->opt).use_reserved_5;
      uStack_40._2_1_ = (this->opt).use_reserved_6;
      uStack_40._3_1_ = (this->opt).use_reserved_7;
      uStack_3c._0_1_ = (this->opt).use_reserved_8;
      uStack_3c._1_1_ = (this->opt).use_reserved_9;
      uStack_3c._2_1_ = (this->opt).use_reserved_10;
      uStack_3c._3_1_ = (this->opt).use_reserved_11;
      if (pLVar1->support_image_storage == false) {
        uStack_4c._0_2_ = (ushort)(byte)(undefined1)uStack_4c;
      }
      iVar6 = (*pLVar1->_vptr_Layer[5])(pLVar1,&local_78);
      if (iVar6 != 0) {
        clear();
      }
      if (((uint)pLVar1->typeindex >> 8 & 1) == 0) {
LAB_001488dd:
        (*pLVar1->_vptr_Layer[1])(pLVar1);
      }
      else {
        uVar7 = (long)pLVar1->typeindex & 0x7fffffffffffeff;
        pcVar2 = (this->d->custom_layer_registry).
                 super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var3 = pcVar2[uVar7].destroyer;
        if (p_Var3 == (layer_destroyer_func)0x0) goto LAB_001488dd;
        (*p_Var3)(pLVar1,pcVar2[uVar7].userdata);
      }
      uVar11 = uVar11 + 1;
      pNVar8 = this->d;
      ppLVar9 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar10 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppLVar10 - (long)ppLVar9 >> 3));
  }
  if (ppLVar10 != ppLVar9) {
    (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar9;
  }
  if (pNVar8->local_blob_allocator != (PoolAllocator *)0x0) {
    (*(pNVar8->local_blob_allocator->super_Allocator)._vptr_Allocator[1])();
    pNVar8 = this->d;
    pNVar8->local_blob_allocator = (PoolAllocator *)0x0;
  }
  if (pNVar8->local_workspace_allocator != (PoolAllocator *)0x0) {
    (*(pNVar8->local_workspace_allocator->super_Allocator)._vptr_Allocator[1])();
    this->d->local_workspace_allocator = (PoolAllocator *)0x0;
  }
  return;
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            delete layer;
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}